

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * lest::to_string<(anonymous_namespace)::State>(string *__return_storage_ptr__,State *value)

{
  uint *puVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  ostringstream os;
  undefined1 *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [16];
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 1;
  std::ostream::operator<<((ostream *)local_190,*value);
  std::__cxx11::ostringstream::str();
  local_1d0 = local_1c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d0,local_1b0,local_1b0 + local_1a8);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_1d0,local_1d0 + local_1c8);
  psVar2 = extraout_RAX;
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
    psVar2 = extraout_RAX_00;
  }
  return psVar2;
}

Assistant:

inline std::string to_string( T const & value )
{
    return string_maker<T>::to_string( value );
}